

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

POwnedObjectsListNode __thiscall
CorUnix::CThreadSynchronizationInfo::RemoveFirstObjectFromOwnedList
          (CThreadSynchronizationInfo *this)

{
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  PLIST_ENTRY _EX_Flink;
  PLIST_ENTRY _EX_Blink;
  PLIST_ENTRY pLink;
  OwnedObjectsListNode *poolnItem;
  CThreadSynchronizationInfo *this_local;
  
  if ((this->m_leOwnedObjsList).Flink == &this->m_leOwnedObjsList) {
    pLink = (PLIST_ENTRY)0x0;
  }
  else {
    pLink = (this->m_leOwnedObjsList).Flink;
    p_Var1 = ((this->m_leOwnedObjsList).Flink)->Flink;
    p_Var2 = ((this->m_leOwnedObjsList).Flink)->Blink;
    p_Var2->Flink = p_Var1;
    p_Var1->Blink = p_Var2;
  }
  return (POwnedObjectsListNode)pLink;
}

Assistant:

POwnedObjectsListNode CThreadSynchronizationInfo::RemoveFirstObjectFromOwnedList()
    {
        OwnedObjectsListNode * poolnItem;

        if (IsListEmpty(&m_leOwnedObjsList))
        {
            poolnItem = NULL;
        }
        else
        {
            PLIST_ENTRY pLink = RemoveHeadList(&m_leOwnedObjsList);
            poolnItem = CONTAINING_RECORD(pLink,
                                          OwnedObjectsListNode,
                                          Link);
        }

        return poolnItem;
    }